

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O1

void __thiscall
Diligent::ShaderResourcesGL::ShaderResourcesGL(ShaderResourcesGL *this,ShaderResourcesGL *Program)

{
  this->m_ShaderStages = Program->m_ShaderStages;
  this->m_UniformBuffers = Program->m_UniformBuffers;
  this->m_Textures = Program->m_Textures;
  this->m_Images = Program->m_Images;
  this->m_StorageBlocks = Program->m_StorageBlocks;
  this->m_NumUniformBuffers = Program->m_NumUniformBuffers;
  this->m_NumTextures = Program->m_NumTextures;
  this->m_NumImages = Program->m_NumImages;
  this->m_NumStorageBlocks = Program->m_NumStorageBlocks;
  (this->m_UBReflectionBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (IMemoryAllocator *)
         (Program->m_UBReflectionBuffer)._M_t.
         super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
         super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
         super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
         super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>.
         _M_head_impl;
  (Program->m_UBReflectionBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (STDDeleter<void,_Diligent::IMemoryAllocator>)0x0;
  (this->m_UBReflectionBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl =
       (Program->m_UBReflectionBuffer)._M_t.
       super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
       super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
       super__Head_base<0UL,_void_*,_false>._M_head_impl;
  (Program->m_UBReflectionBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  Program->m_UniformBuffers = (UniformBufferInfo *)0x0;
  Program->m_Textures = (TextureInfo *)0x0;
  Program->m_Images = (ImageInfo *)0x0;
  Program->m_StorageBlocks = (StorageBlockInfo *)0x0;
  Program->m_NumUniformBuffers = 0;
  Program->m_NumTextures = 0;
  Program->m_NumImages = 0;
  Program->m_NumStorageBlocks = 0;
  return;
}

Assistant:

ShaderResourcesGL::ShaderResourcesGL(ShaderResourcesGL&& Program) noexcept :
    // clang-format off
    m_ShaderStages      {Program.m_ShaderStages     },
    m_UniformBuffers    {Program.m_UniformBuffers   },
    m_Textures          {Program.m_Textures         },
    m_Images            {Program.m_Images           },
    m_StorageBlocks     {Program.m_StorageBlocks    },
    m_NumUniformBuffers {Program.m_NumUniformBuffers},
    m_NumTextures       {Program.m_NumTextures      },
    m_NumImages         {Program.m_NumImages        },
    m_NumStorageBlocks  {Program.m_NumStorageBlocks },
    m_UBReflectionBuffer{std::move(Program.m_UBReflectionBuffer)}
// clang-format on
{
    Program.m_UniformBuffers = nullptr;
    Program.m_Textures       = nullptr;
    Program.m_Images         = nullptr;
    Program.m_StorageBlocks  = nullptr;

    Program.m_NumUniformBuffers = 0;
    Program.m_NumTextures       = 0;
    Program.m_NumImages         = 0;
    Program.m_NumStorageBlocks  = 0;
}